

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

uint * Lpk_CutTruth_rec(Hop_Man_t *pMan,Hop_Obj_t *pObj,int nVars,Vec_Ptr_t *vTtNodes,int *piCount)

{
  int iVar1;
  int fCompl1;
  Hop_Obj_t *pHVar2;
  uint *pIn0;
  uint *pIn1;
  uint *pTruth1;
  uint *pTruth0;
  uint *pTruth;
  int *piCount_local;
  Vec_Ptr_t *vTtNodes_local;
  int nVars_local;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *pMan_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                  ,0x8d,
                  "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  if ((pObj->field_0).pData == (void *)0x0) {
    iVar1 = *piCount;
    *piCount = iVar1 + 1;
    pMan_local = (Hop_Man_t *)Vec_PtrEntry(vTtNodes,iVar1);
    iVar1 = Hop_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      iVar1 = Hop_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Hop_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                      ,0x99,
                      "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                     );
      }
      pHVar2 = Hop_ObjFanin0(pObj);
      pIn0 = Lpk_CutTruth_rec(pMan,pHVar2,nVars,vTtNodes,piCount);
      pHVar2 = Hop_ObjFanin1(pObj);
      pIn1 = Lpk_CutTruth_rec(pMan,pHVar2,nVars,vTtNodes,piCount);
      iVar1 = Hop_ObjFaninC0(pObj);
      fCompl1 = Hop_ObjFaninC1(pObj);
      Kit_TruthAndPhase((uint *)pMan_local,pIn0,pIn1,nVars,iVar1,fCompl1);
    }
    else {
      Kit_TruthFill((uint *)pMan_local,nVars);
    }
    (pObj->field_0).pData = pMan_local;
  }
  else {
    if (((ulong)(pObj->field_0).pData & 0xffff0000) == 0) {
      __assert_fail("((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                    ,0x90,
                    "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                   );
    }
    pMan_local = (Hop_Man_t *)(pObj->field_0).pData;
  }
  return (uint *)pMan_local;
}

Assistant:

unsigned * Lpk_CutTruth_rec( Hop_Man_t * pMan, Hop_Obj_t * pObj, int nVars, Vec_Ptr_t * vTtNodes, int * piCount )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    assert( !Hop_IsComplement(pObj) );
    if ( pObj->pData )
    {
        assert( ((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000 );
        return (unsigned *)pObj->pData;
    }
    // get the plan for a new truth table
    pTruth = (unsigned *)Vec_PtrEntry( vTtNodes, (*piCount)++ );
    if ( Hop_ObjIsConst1(pObj) )
        Kit_TruthFill( pTruth, nVars );
    else
    {
        assert( Hop_ObjIsAnd(pObj) );
        // compute the truth tables of the fanins
        pTruth0 = Lpk_CutTruth_rec( pMan, Hop_ObjFanin0(pObj), nVars, vTtNodes, piCount );
        pTruth1 = Lpk_CutTruth_rec( pMan, Hop_ObjFanin1(pObj), nVars, vTtNodes, piCount );
        // creat the truth table of the node
        Kit_TruthAndPhase( pTruth, pTruth0, pTruth1, nVars, Hop_ObjFaninC0(pObj), Hop_ObjFaninC1(pObj) );
    }
    pObj->pData = pTruth;
    return pTruth;
}